

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O0

uint __thiscall ExecutorRegVm::GetCallStackAddress(ExecutorRegVm *this,uint frame)

{
  RegVmCmd *pRVar1;
  uint uVar2;
  RegVmCmd **ppRVar3;
  RegVmCmd *instruction;
  uint frame_local;
  ExecutorRegVm *this_local;
  
  uVar2 = FastVector<RegVmCmd_*,_false,_false>::size(&this->callStack);
  if (frame < uVar2) {
    ppRVar3 = FastVector<RegVmCmd_*,_false,_false>::operator[](&this->callStack,frame);
    pRVar1 = *ppRVar3;
    if ((pRVar1 < (this->breakCode).data) ||
       ((this->breakCode).data + (this->breakCode).count <= pRVar1)) {
      this_local._4_4_ = (uint)((long)pRVar1 - (long)this->codeBase >> 3);
    }
    else {
      if (pRVar1->code != '\0') {
        __assert_fail("instruction->code == rviNop",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                      ,0x6dd,"unsigned int ExecutorRegVm::GetCallStackAddress(unsigned int)");
      }
      this_local._4_4_ = pRVar1->argument;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

unsigned ExecutorRegVm::GetCallStackAddress(unsigned frame)
{
	if(frame >= callStack.size())
		return 0;

	RegVmCmd *instruction = callStack[frame];

	if(instruction >= breakCode.data && instruction < breakCode.data + breakCode.count)
	{
		assert(instruction->code == rviNop);

		return instruction->argument;
	}

	return unsigned(instruction - codeBase);
}